

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O2

bool jiesuan(int a,int b,int c,int d,string *cal)

{
  char c_00;
  char c_01;
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  string pos;
  long local_110 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)local_110,"+-*/",(allocator *)&local_50);
  lVar1 = local_110[0];
  uVar3 = 0;
  do {
    if (uVar3 == 4) {
LAB_00104854:
      std::__cxx11::string::~string((string *)local_110);
      return uVar3 < 4;
    }
    c_00 = *(char *)(lVar1 + uVar3);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      c_01 = *(char *)(lVar1 + lVar2);
      lVar4 = 0;
      while (lVar4 != 4) {
        dVar5 = cal_24((double)a,c_00,(double)b);
        dVar5 = cal_24(dVar5,c_01,(double)c);
        dVar5 = cal_24(dVar5,*(char *)(lVar1 + lVar4),(double)d);
        lVar4 = lVar4 + 1;
        if ((dVar5 == 24.0) && (!NAN(dVar5))) {
          std::operator+(&local_f0,
                         poker_dict_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)a + -1,c_00);
          std::operator+(&local_d0,&local_f0,
                         poker_dict_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)b + -1);
          std::operator+(&local_b0,&local_d0,*(char *)(local_110[0] + lVar2));
          std::operator+(&local_90,&local_b0,
                         poker_dict_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)c + -1);
          std::operator+(&local_70,&local_90,*(char *)(local_110[0] + -1 + lVar4));
          std::operator+(&local_50,&local_70,
                         poker_dict_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)d + -1);
          std::__cxx11::string::operator=((string *)cal,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          goto LAB_00104854;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool jiesuan(int a,int b,int c,int d, string &  cal)
{
    string pos="+-*/";
    for (int i=0;i<4;i++)
    {
        for (int j=0;j<4;j++)
        {
            for (int k=0;k<4;k++)
            {
               if (cal_24(cal_24(cal_24(a,pos[i],b),pos[j],c),pos[k],d) == 24.0000)
               {
                   cal = poker_dict[a-1]+pos[i]+poker_dict[b-1]+pos[j]+poker_dict[c-1]+pos[k]+poker_dict[d-1];
                   return true;
               } 
            }
        }
    }
    return false;
}